

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void restassign(LexState *ls,LHS_assign *lh,int nvars)

{
  expdesc *e_00;
  l_uint32 *plVar1;
  byte bVar2;
  expkind eVar3;
  bool bVar4;
  int nexps;
  OpCode o;
  FuncState *pFVar5;
  expdesc e;
  undefined1 local_48 [8];
  expdesc local_40;
  
  if (6 < (lh->v).k - VLOCAL) {
    luaX_syntaxerror(ls,"syntax error");
  }
  e_00 = &lh->v;
  check_readonly(ls,e_00);
  if ((ls->t).token == 0x2c) {
    luaX_next(ls);
    local_48 = (undefined1  [8])lh;
    suffixedexp(ls,&local_40);
    if ((local_40.k & 0xfffffffc) != 0xc) {
      pFVar5 = ls->fs;
      bVar2 = pFVar5->freereg;
      bVar4 = false;
      do {
        eVar3 = (lh->v).k;
        if ((eVar3 & ~VFALSE) == VINDEXED) {
          if (eVar3 == VINDEXUP) {
            if ((local_40.k == 10) && (local_40.u.info == (uint)(lh->v).u.ind.t)) {
              (lh->v).k = VINDEXSTR;
              (lh->v).u.ind.t = bVar2;
LAB_0011e9f2:
              bVar4 = true;
            }
          }
          else if (local_40.k == 9) {
            if ((lh->v).u.ind.t == local_40.u.var.ridx) {
              (lh->v).u.ind.t = bVar2;
              bVar4 = true;
            }
            if ((eVar3 == VINDEXED) && ((lh->v).u.ind.idx == (ushort)local_40.u.var.ridx)) {
              *(ushort *)&(lh->v).u = (ushort)bVar2;
              goto LAB_0011e9f2;
            }
          }
        }
        lh = lh->prev;
      } while (lh != (LHS_assign *)0x0);
      if (bVar4) {
        if (local_40.k == 9) {
          local_40.u.info = local_40.u.info & 0xff;
          o = OP_MOVE;
        }
        else {
          o = OP_GETUPVAL;
        }
        luaK_codeABCk(pFVar5,o,(uint)bVar2,local_40.u.info,0,0);
        luaK_reserveregs(pFVar5,1);
      }
    }
    luaE_incCstack(ls->L);
    restassign(ls,(LHS_assign *)local_48,nvars + 1);
    plVar1 = &ls->L->nCcalls;
    *plVar1 = *plVar1 - 1;
  }
  else {
    checknext(ls,0x3d);
    nexps = explist(ls,(expdesc *)local_48);
    if (nexps == nvars) {
      luaK_setoneret(ls->fs,(expdesc *)local_48);
      pFVar5 = ls->fs;
      goto LAB_0011eab6;
    }
    adjust_assign((LexState *)ls->fs,nvars,nexps,(expdesc *)local_48);
  }
  pFVar5 = ls->fs;
  local_40.k = pFVar5->freereg - 1;
  local_40.u.ival = -1;
  local_48._0_4_ = 8;
LAB_0011eab6:
  luaK_storevar(pFVar5,e_00,(expdesc *)local_48);
  return;
}

Assistant:

static void restassign (LexState *ls, struct LHS_assign *lh, int nvars) {
  expdesc e;
  check_condition(ls, vkisvar(lh->v.k), "syntax error");
  check_readonly(ls, &lh->v);
  if (testnext(ls, ',')) {  /* restassign -> ',' suffixedexp restassign */
    struct LHS_assign nv;
    nv.prev = lh;
    suffixedexp(ls, &nv.v);
    if (!vkisindexed(nv.v.k))
      check_conflict(ls, lh, &nv.v);
    enterlevel(ls);  /* control recursion depth */
    restassign(ls, &nv, nvars+1);
    leavelevel(ls);
  }
  else {  /* restassign -> '=' explist */
    int nexps;
    checknext(ls, '=');
    nexps = explist(ls, &e);
    if (nexps != nvars)
      adjust_assign(ls, nvars, nexps, &e);
    else {
      luaK_setoneret(ls->fs, &e);  /* close last expression */
      luaK_storevar(ls->fs, &lh->v, &e);
      return;  /* avoid default */
    }
  }
  init_exp(&e, VNONRELOC, ls->fs->freereg-1);  /* default assignment */
  luaK_storevar(ls->fs, &lh->v, &e);
}